

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O2

bool __thiscall Json::OurReader::decodeDouble(OurReader *this,Token *token,Value *decoded)

{
  int iVar1;
  string *this_00;
  ulong __n;
  double value;
  Char buffer [33];
  LargestInt local_d0;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  ValueHolder local_58;
  undefined2 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  local_d0 = 0;
  __n = (long)token->end_ - (long)token->start_;
  if ((long)__n < 0) {
    std::__cxx11::string::string
              ((string *)&local_c8,"Unable to parse token length",(allocator *)&local_78);
    addError(this,&local_c8,token,(Location)0x0);
    this_00 = &local_c8;
  }
  else {
    if (__n < 0x21) {
      memcpy(&local_c8,token->start_,__n);
      *(undefined1 *)((long)&local_c8 + __n) = 0;
      iVar1 = __isoc99_sscanf(&local_c8,&DAT_0011b2e6,&local_d0);
    }
    else {
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8);
      iVar1 = __isoc99_sscanf(local_c8._M_dataplus._M_p,&DAT_0011b2e6,&local_d0);
      std::__cxx11::string::~string((string *)&local_c8);
    }
    if (iVar1 == 1) {
      local_50 = 3;
      local_48 = 0;
      uStack_40 = 0;
      local_38 = 0;
      local_58.int_ = local_d0;
      Value::swap(decoded,(Value *)&local_58);
      Value::~Value((Value *)&local_58);
      return true;
    }
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,token->start_,token->end_);
    std::operator+(&local_78,"\'",&local_98);
    std::operator+(&local_c8,&local_78,"\' is not a number.");
    addError(this,&local_c8,token,(Location)0x0);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_78);
    this_00 = &local_98;
  }
  std::__cxx11::string::~string((string *)this_00);
  return false;
}

Assistant:

bool OurReader::decodeDouble(Token& token, Value& decoded) {
  double value = 0;
  const int bufferSize = 32;
  int count;
  ptrdiff_t const length = token.end_ - token.start_;

  // Sanity check to avoid buffer overflow exploits.
  if (length < 0) {
    return addError("Unable to parse token length", token);
  }
  size_t const ulength = static_cast<size_t>(length);

  // Avoid using a string constant for the format control string given to
  // sscanf, as this can cause hard to debug crashes on OS X. See here for more
  // info:
  //
  //     http://developer.apple.com/library/mac/#DOCUMENTATION/DeveloperTools/gcc-4.0.1/gcc/Incompatibilities.html
  char format[] = "%lf";

  if (length <= bufferSize) {
    Char buffer[bufferSize + 1];
    memcpy(buffer, token.start_, ulength);
    buffer[length] = 0;
    count = sscanf(buffer, format, &value);
  } else {
    JSONCPP_STRING buffer(token.start_, token.end_);
    count = sscanf(buffer.c_str(), format, &value);
  }

  if (count != 1)
    return addError("'" + JSONCPP_STRING(token.start_, token.end_) +
                        "' is not a number.",
                    token);
  decoded = value;
  return true;
}